

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

Builder * __thiscall capnp::DynamicValue::Builder::operator=(Builder *this,Builder *other)

{
  SegmentBuilder *pSVar1;
  SegmentBuilder *pSVar2;
  int64_t iVar3;
  char *pcVar4;
  size_t sVar5;
  CapTableBuilder *pCVar6;
  byte *pbVar7;
  BitsPerElementN<23> BVar8;
  StructDataBitCount SVar9;
  StructPointerCount SVar10;
  ElementSize EVar11;
  undefined1 uVar12;
  Type TVar13;
  undefined4 uVar14;
  
  if ((this->type == CAPABILITY) &&
     (pSVar1 = (this->field_1).structValue.builder.segment, pSVar1 != (SegmentBuilder *)0x0)) {
    (this->field_1).textValue.content.ptr = (char *)0x0;
    pSVar2 = (this->field_1).anyPointerValue.builder.segment;
    (*(code *)((pSVar2->super_SegmentReader).arena)->_vptr_Arena)
              (pSVar2,(long)&(pSVar1->super_SegmentReader).arena +
                      (long)(pSVar1->super_SegmentReader).arena[-2]._vptr_Arena);
  }
  if (other->type == CAPABILITY) {
    this->type = CAPABILITY;
    (*(code *)(((other->field_1).structValue.builder.segment)->super_SegmentReader).arena[4].
              _vptr_Arena)(&this->field_1);
    (this->field_1).textValue.content.size_ = (other->field_1).textValue.content.size_;
  }
  else {
    TVar13 = other->type;
    uVar14 = *(undefined4 *)&other->field_0x4;
    iVar3 = (other->field_1).intValue;
    pcVar4 = (other->field_1).textValue.content.ptr;
    sVar5 = (other->field_1).textValue.content.size_;
    pCVar6 = (other->field_1).listValue.builder.capTable;
    pbVar7 = (other->field_1).listValue.builder.ptr;
    BVar8 = *(BitsPerElementN<23> *)((long)&other->field_1 + 0x2c);
    SVar9 = *(StructDataBitCount *)((long)&other->field_1 + 0x30);
    SVar10 = *(StructPointerCount *)((long)&other->field_1 + 0x34);
    EVar11 = *(ElementSize *)((long)&other->field_1 + 0x36);
    uVar12 = *(undefined1 *)((long)&other->field_1 + 0x37);
    *(ListElementCount *)((long)&this->field_1 + 0x28) =
         *(ListElementCount *)((long)&other->field_1 + 0x28);
    *(BitsPerElementN<23> *)((long)&this->field_1 + 0x2c) = BVar8;
    *(StructDataBitCount *)((long)&this->field_1 + 0x30) = SVar9;
    *(StructPointerCount *)((long)&this->field_1 + 0x34) = SVar10;
    *(ElementSize *)((long)&this->field_1 + 0x36) = EVar11;
    *(undefined1 *)((long)&this->field_1 + 0x37) = uVar12;
    (this->field_1).listValue.builder.capTable = pCVar6;
    (this->field_1).listValue.builder.ptr = pbVar7;
    (this->field_1).textValue.content.ptr = pcVar4;
    (this->field_1).textValue.content.size_ = sVar5;
    this->type = TVar13;
    *(undefined4 *)&this->field_0x4 = uVar14;
    (this->field_1).intValue = iVar3;
  }
  return this;
}

Assistant:

DynamicValue::Builder& DynamicValue::Builder::operator=(Builder& other) {
  if (type == CAPABILITY) {
    kj::dtor(capabilityValue);
  }
  kj::ctor(*this, other);
  return *this;
}